

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_load.c
# Opt level: O1

void cmd_load_help(void)

{
  puts(
      "Usage: load [-i] <module-name1>[@<revision>] [<module-name2>[@revision] ...]\n                  Add a new module of the specified name, yanglint will find\n                  them in searchpaths. If the <revision> of the module not\n                  specified, the latest revision available is loaded.\n\n  -F FEATURES, --features=FEATURES\n                  Features to support, default all in all implemented modules.\n                  <modname>:[<feature>,]*\n  -i, --make-implemented\n                  Make the imported modules \"referenced\" from any loaded\n                  <schema> module also implemented. If specified a second time,\n                  all the modules are set implemented.\n  -X, --extended-leafref\n                  Allow usage of deref() XPath function within leafref."
      );
  return;
}

Assistant:

void
cmd_load_help(void)
{
    printf("Usage: load [-i] <module-name1>[@<revision>] [<module-name2>[@revision] ...]\n"
            "                  Add a new module of the specified name, yanglint will find\n"
            "                  them in searchpaths. If the <revision> of the module not\n"
            "                  specified, the latest revision available is loaded.\n\n"
            "  -F FEATURES, --features=FEATURES\n"
            "                  Features to support, default all in all implemented modules.\n"
            "                  <modname>:[<feature>,]*\n"
            "  -i, --make-implemented\n"
            "                  Make the imported modules \"referenced\" from any loaded\n"
            "                  <schema> module also implemented. If specified a second time,\n"
            "                  all the modules are set implemented.\n"
            "  -X, --extended-leafref\n"
            "                  Allow usage of deref() XPath function within leafref.\n");
}